

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O1

Vec_Int_t *
Gia_PolynCoreOrder(Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Int_t *vAddCos,Vec_Int_t **pvIns,
                  Vec_Int_t **pvOuts)

{
  int iVar1;
  void *__ptr;
  Vec_Wec_t *vMap;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  long lVar6;
  
  vMap = Gia_PolynComputeMap(vAdds,pGia->nObjs);
  iVar1 = pGia->vCos->nSize;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar5;
  if (iVar5 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar2->pArray = piVar3;
  pVVar4 = pGia->vCos;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      iVar1 = pVVar4->pArray[lVar6];
      if (((long)iVar1 < 0) || (pGia->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Vec_IntPush(pVVar2,iVar1 - (*(uint *)(pGia->pObjs + iVar1) & 0x1fffffff));
      lVar6 = lVar6 + 1;
      pVVar4 = pGia->vCos;
    } while (lVar6 < pVVar4->nSize);
  }
  if ((vAddCos != (Vec_Int_t *)0x0) && (0 < vAddCos->nSize)) {
    lVar6 = 0;
    do {
      Vec_IntPush(pVVar2,vAddCos->pArray[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < vAddCos->nSize);
  }
  if (pvOuts != (Vec_Int_t **)0x0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    iVar1 = pVVar2->nSize;
    lVar6 = (long)iVar1;
    pVVar4->nSize = iVar1;
    pVVar4->nCap = iVar1;
    if (lVar6 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc(lVar6 * 4);
    }
    pVVar4->pArray = piVar3;
    memcpy(piVar3,pVVar2->pArray,lVar6 << 2);
    *pvOuts = pVVar4;
  }
  pVVar4 = Gia_PolynCoreOrder_int(pGia,vAdds,vMap,pVVar2,pvIns);
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  free(pVVar2);
  iVar1 = vMap->nCap;
  if (0 < (long)iVar1) {
    pVVar2 = vMap->pArray;
    lVar6 = 0;
    do {
      __ptr = *(void **)((long)&pVVar2->pArray + lVar6);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar2->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar6);
  }
  if (vMap->pArray != (Vec_Int_t *)0x0) {
    free(vMap->pArray);
    vMap->pArray = (Vec_Int_t *)0x0;
  }
  vMap->nCap = 0;
  vMap->nSize = 0;
  free(vMap);
  printf("Collected %d boxes.\n",(ulong)(uint)pVVar4->nSize);
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_PolynCoreOrder( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Int_t * vAddCos, Vec_Int_t ** pvIns, Vec_Int_t ** pvOuts )
{
    Vec_Int_t * vOrder;
    Vec_Wec_t * vMap = Gia_PolynComputeMap( vAdds, Gia_ManObjNum(pGia) );
    Vec_Int_t * vRoots = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    int i, Driver;
    // collect roots
    Gia_ManForEachCoDriverId( pGia, Driver, i )
        Vec_IntPush( vRoots, Driver );
    // collect additional outputs
    if ( vAddCos )
        Vec_IntForEachEntry( vAddCos, Driver, i )
            Vec_IntPush( vRoots, Driver );
    // remember roots
    if ( pvOuts )
        *pvOuts = Vec_IntDup( vRoots );
    // create order
    vOrder = Gia_PolynCoreOrder_int( pGia, vAdds, vMap, vRoots, pvIns );
    Vec_IntFree( vRoots );
    Vec_WecFree( vMap );
    printf( "Collected %d boxes.\n", Vec_IntSize(vOrder) );
    return vOrder;
}